

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

int main(void)

{
  clinet app;
  clinet local_20;
  
  local_20.super_imanager._vptr_imanager = (_func_int **)&PTR_on_accept_00109b98;
  local_20.network_ = (inetwork *)0x0;
  local_20.closed_ = false;
  local_20.netid_ = 0;
  local_20.userid_ = 0;
  clinet::run(&local_20);
  puts("exit");
  return 0;
}

Assistant:

int main()
{
    clinet app;
    app.run();
    printf("exit\n");
    return 0;
}